

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftcolor.c
# Opt level: O0

FT_Error FT_Palette_Set_Foreground_Color(FT_Face face,FT_Color foreground_color)

{
  TT_Face_conflict ttface;
  FT_Face face_local;
  FT_Color foreground_color_local;
  
  if (face == (FT_Face)0x0) {
    face_local._4_4_ = 0x23;
  }
  else if ((face->face_flags & 8U) == 0) {
    face_local._4_4_ = 0;
  }
  else {
    *(FT_Color *)((long)&face[4].bbox.yMin + 1) = foreground_color;
    *(undefined1 *)&face[4].bbox.yMin = 1;
    face_local._4_4_ = 0;
  }
  return face_local._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Palette_Set_Foreground_Color( FT_Face   face,
                                   FT_Color  foreground_color )
  {
    TT_Face  ttface;


    if ( !face )
      return FT_THROW( Invalid_Face_Handle );

    if ( !FT_IS_SFNT( face ) )
      return FT_Err_Ok;

    ttface = (TT_Face)face;

    ttface->foreground_color      = foreground_color;
    ttface->have_foreground_color = 1;

    return FT_Err_Ok;
  }